

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParenthesizedSequenceExprSyntax *pPVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  SequenceMatchListSyntax *in_stack_ffffffffffffffa0;
  SequenceMatchListSyntax *local_58;
  
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  not_null<slang::syntax::SequenceExprSyntax_*>::operator*
            ((not_null<slang::syntax::SequenceExprSyntax_*> *)0x7bc793);
  deepClone<slang::syntax::SequenceExprSyntax>
            ((SequenceExprSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (*(long *)(__fn + 0x30) == 0) {
    local_58 = (SequenceMatchListSyntax *)0x0;
  }
  else {
    local_58 = deepClone<slang::syntax::SequenceMatchListSyntax>
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  TVar3 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  if (*(long *)(__fn + 0x48) != 0) {
    deepClone<slang::syntax::SequenceRepetitionSyntax>
              ((SequenceRepetitionSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParenthesizedSequenceExprSyntax,slang::parsing::Token,slang::syntax::SequenceExprSyntax&,slang::syntax::SequenceMatchListSyntax*,slang::parsing::Token,slang::syntax::SequenceRepetitionSyntax*>
                     ((BumpAllocator *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      (SequenceMatchListSyntax **)local_58,(Token *)TVar3.info,TVar3._0_8_);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParenthesizedSequenceExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParenthesizedSequenceExprSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<SequenceExprSyntax>(*node.expr, alloc),
        node.matchList ? deepClone(*node.matchList, alloc) : nullptr,
        node.closeParen.deepClone(alloc),
        node.repetition ? deepClone(*node.repetition, alloc) : nullptr
    );
}